

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O3

void __thiscall TestCase::~TestCase(TestCase *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_TestCase = (_func_int **)&PTR__TestCase_00108d08;
  pcVar1 = (this->mErrorString)._M_dataplus._M_p;
  paVar2 = &(this->mErrorString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->mFilename)._M_dataplus._M_p;
  paVar2 = &(this->mFilename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  Mutex::~Mutex(&this->mMutex);
  JHThread::Thread::~Thread(&(this->mThread).super_Thread);
  pcVar1 = (this->mTestName)._M_dataplus._M_p;
  paVar2 = &(this->mTestName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~TestCase() 
	{
	}